

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O2

Coordinate
diy::detail::BoundsHelper<diy::Bounds<int>,_void>::to
          (int i,int n,Coordinate min,Coordinate max,bool shared_face)

{
  if (n + -1 != i) {
    max = (min - (uint)!shared_face) + (((max - min) + 1) / n) * (i + 1);
  }
  return max;
}

Assistant:

static Coordinate   to  (int i, int n, Coordinate min, Coordinate max, bool shared_face)
    {
      if (i == n - 1)
        return max;
      else
        return from(i+1, n, min, max, shared_face) - (shared_face ? 0 : 1);
    }